

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall IteratorTest::coordinateTest<true>(IteratorTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  bool local_351;
  bool local_329;
  bool local_301;
  bool local_2d1;
  unsigned_long *local_2d0;
  allocator<unsigned_long> local_2c1;
  undefined1 local_2c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c_2;
  size_t x_2;
  size_t y_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_2;
  undefined1 local_250 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_208 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  allocator<unsigned_long> local_1d9;
  undefined1 local_1d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c_1;
  size_t x_1;
  size_t y_1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it_1;
  undefined1 local_168 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_120 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  allocator<unsigned_long> local_f1;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  size_t x;
  size_t y;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  undefined1 local_80 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  IteratorTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar3 = 8;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_80,0);
  for (x = 0; x < 8; x = x + 1) {
    for (c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < (pointer)0x3;
        c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::allocator<unsigned_long>::allocator(&local_f1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,2,&local_f1);
      std::allocator<unsigned_long>::~allocator(&local_f1);
      iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&y,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )iVar4._M_current);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,0);
      local_301 = false;
      if ((pointer)*pvVar3 ==
          c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,1);
        local_301 = *pvVar3 == x;
      }
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = local_301;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
    }
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120,1);
  *pvVar3 = 8;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120);
  paVar1 = (allocator<int> *)
           ((long)&it_1.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_168,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_1,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_168,0);
  for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
    for (c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < (pointer)0x3;
        c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::allocator<unsigned_long>::allocator(&local_1d9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8,2,&local_1d9);
      std::allocator<unsigned_long>::~allocator(&local_1d9);
      iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8);
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&y_1,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )iVar4._M_current);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8,0);
      local_329 = false;
      if ((pointer)*pvVar3 ==
          c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8,1);
        local_329 = *pvVar3 == x_1;
      }
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = local_329;
      test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1d8);
    }
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_168);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,1);
  *pvVar3 = 8;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_250,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_2,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_250,0);
  for (x_2 = 0; x_2 < 8; x_2 = x_2 + 1) {
    for (c_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        c_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < (pointer)0x3;
        c_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)c_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::allocator<unsigned_long>::allocator(&local_2c1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c0,2,&local_2c1);
      std::allocator<unsigned_long>::~allocator(&local_2c1);
      local_2d0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c0);
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&y_2,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_2d0);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c0,0);
      local_351 = false;
      if ((pointer)*pvVar3 ==
          c_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c0,1);
        local_351 = *pvVar3 == x_2;
      }
      local_2d1 = local_351;
      test(&local_2d1);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c0);
    }
  }
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&y_2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_250);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
  return;
}

Assistant:

void IteratorTest::coordinateTest() {
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
}